

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O1

void aom_lpf_horizontal_14_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  byte bVar12;
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  byte bVar67;
  byte bVar68;
  byte bVar69;
  byte bVar70;
  byte bVar71;
  byte bVar72;
  byte bVar73;
  byte bVar74;
  undefined1 auVar75 [16];
  undefined1 auVar76 [15];
  unkuint9 Var77;
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  unkuint9 Var80;
  undefined1 auVar81 [15];
  undefined1 auVar82 [15];
  unkuint9 Var83;
  undefined1 auVar84 [15];
  undefined1 auVar85 [15];
  unkuint9 Var86;
  undefined1 auVar87 [15];
  undefined1 auVar88 [15];
  undefined1 auVar89 [11];
  undefined1 auVar90 [15];
  undefined1 auVar91 [15];
  undefined1 auVar92 [15];
  undefined1 auVar93 [11];
  undefined1 auVar94 [15];
  undefined1 auVar95 [15];
  undefined1 auVar96 [15];
  undefined1 auVar97 [15];
  undefined1 auVar98 [15];
  undefined1 auVar99 [15];
  undefined1 auVar100 [15];
  undefined1 auVar101 [15];
  undefined1 auVar102 [15];
  long lVar103;
  byte bVar104;
  byte bVar107;
  byte bVar109;
  byte bVar111;
  char cVar113;
  char cVar114;
  char cVar115;
  char cVar116;
  byte bVar117;
  byte bVar118;
  byte bVar119;
  byte bVar120;
  undefined1 auVar105 [16];
  char cVar108;
  char cVar110;
  char cVar112;
  undefined1 auVar106 [16];
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  undefined1 auVar121 [16];
  short sVar128;
  short sVar133;
  short sVar135;
  short sVar136;
  short sVar137;
  ulong uVar129;
  short sVar132;
  short sVar134;
  short sVar138;
  short sVar139;
  short sVar140;
  short sVar141;
  short sVar142;
  short sVar143;
  undefined1 auVar130 [16];
  short sVar144;
  short sVar145;
  ushort uVar146;
  short sVar149;
  short sVar150;
  undefined4 uVar151;
  short sVar152;
  ushort uVar153;
  short sVar154;
  short sVar155;
  short sVar156;
  short sVar157;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  ushort uVar158;
  ushort uVar160;
  undefined1 auVar159 [16];
  short sVar161;
  ushort uVar162;
  short sVar163;
  short sVar164;
  short sVar165;
  short sVar167;
  short sVar168;
  short sVar169;
  short sVar170;
  short sVar171;
  short sVar172;
  short sVar173;
  short sVar174;
  short sVar175;
  undefined1 auVar166 [16];
  undefined1 auVar176 [16];
  short sVar177;
  short sVar178;
  short sVar179;
  short sVar180;
  short sVar181;
  short sVar182;
  short sVar183;
  short sVar186;
  short sVar187;
  short sVar188;
  short sVar189;
  short sVar190;
  short sVar191;
  short sVar192;
  short sVar193;
  short sVar194;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  short sVar195;
  ushort uVar196;
  uint uVar197;
  undefined4 uVar198;
  short sVar200;
  ushort uVar201;
  short sVar202;
  ushort uVar203;
  undefined4 uVar204;
  short sVar205;
  ushort uVar206;
  short sVar207;
  ushort uVar208;
  ushort uVar209;
  short sVar210;
  ushort uVar211;
  ushort uVar212;
  short sVar213;
  ushort uVar214;
  ushort uVar215;
  undefined1 auVar199 [16];
  ushort uVar216;
  ushort uVar217;
  byte bVar218;
  byte bVar219;
  short sVar220;
  short sVar221;
  short sVar222;
  byte bVar224;
  byte bVar225;
  short sVar226;
  short sVar227;
  short sVar228;
  byte bVar229;
  byte bVar230;
  byte bVar231;
  byte bVar232;
  byte bVar233;
  short sVar234;
  short sVar235;
  short sVar236;
  byte bVar237;
  byte bVar238;
  byte bVar239;
  short sVar240;
  short sVar241;
  short sVar242;
  short sVar243;
  byte bVar244;
  byte bVar245;
  byte bVar246;
  byte bVar247;
  byte bVar248;
  byte bVar249;
  byte bVar250;
  byte bVar251;
  byte bVar252;
  byte bVar253;
  byte bVar254;
  byte bVar255;
  byte bVar256;
  undefined1 auVar223 [16];
  short sVar259;
  short sVar260;
  short sVar261;
  short sVar262;
  short sVar263;
  short sVar264;
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  ushort uVar265;
  short sVar267;
  byte bVar268;
  short sVar269;
  byte bVar270;
  byte bVar272;
  short sVar271;
  byte bVar273;
  byte bVar275;
  short sVar274;
  byte bVar276;
  byte bVar278;
  short sVar277;
  byte bVar279;
  byte bVar281;
  short sVar280;
  byte bVar282;
  undefined1 auVar266 [16];
  byte bVar284;
  ushort uVar283;
  ulong uVar285;
  undefined1 auVar286 [16];
  undefined1 auVar295 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar306 [16];
  ulong uVar307;
  ulong local_108;
  undefined1 local_f8 [16];
  undefined1 auVar131 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar296 [16];
  undefined1 auVar299 [16];
  undefined1 uVar300;
  undefined1 uVar301;
  undefined1 uVar302;
  undefined1 uVar303;
  undefined1 uVar304;
  undefined1 uVar305;
  
  lVar103 = (long)p;
  uVar1 = *(undefined4 *)(s + lVar103 * -5);
  uVar2 = *(undefined4 *)(s + lVar103 * -4);
  uVar3 = *(undefined4 *)(s + lVar103 * 3);
  auVar306._0_8_ = CONCAT44(uVar3,uVar2);
  auVar306._8_8_ = 0;
  uVar4 = *(undefined4 *)(s + lVar103 * -3);
  uVar5 = *(undefined4 *)(s + lVar103 * -2);
  uVar6 = *(undefined4 *)(s + -lVar103);
  uVar7 = *(undefined4 *)(s + lVar103 * -6);
  uVar8 = *(undefined4 *)(s + lVar103 * 2);
  auVar121._0_8_ = CONCAT44(uVar8,uVar4);
  auVar121._8_8_ = 0;
  uVar9 = *(undefined4 *)(s + lVar103);
  auVar159._0_8_ = CONCAT44(uVar9,uVar5);
  auVar159._8_8_ = 0;
  uVar10 = *(undefined4 *)s;
  auVar257._0_8_ = CONCAT44(uVar10,uVar6);
  auVar257._8_8_ = 0;
  auVar131._8_4_ = uVar10;
  auVar131._0_8_ = auVar257._0_8_;
  auVar131._12_4_ = uVar9;
  auVar130._8_8_ = auVar131._8_8_;
  auVar130._4_4_ = uVar5;
  auVar130._0_4_ = uVar6;
  auVar166._8_8_ = 0;
  auVar166._0_8_ = auVar130._8_8_;
  auVar105 = psubusb(auVar130,auVar166);
  auVar147 = psubusb(auVar166,auVar130);
  auVar147 = auVar147 | auVar105;
  auVar148 = paddusb(auVar147,auVar147);
  auVar105._0_2_ = auVar147._4_2_ >> 1;
  auVar105._2_2_ = auVar147._6_2_ >> 1;
  auVar105._4_2_ = auVar147._8_2_ >> 1;
  auVar105._6_2_ = auVar147._10_2_ >> 1;
  auVar105._8_2_ = auVar147._12_2_ >> 1;
  auVar105._10_2_ = auVar147._14_2_ >> 1;
  auVar105._12_4_ = 0;
  auVar105 = paddusb(auVar105 & _DAT_00c1e0d0,auVar148);
  auVar105 = psubusb(auVar105,*(undefined1 (*) [16])_blimit);
  bVar67 = *_thresh;
  bVar68 = _thresh[1];
  bVar69 = _thresh[2];
  bVar70 = _thresh[3];
  bVar71 = _thresh[4];
  bVar72 = _thresh[5];
  bVar73 = _thresh[6];
  bVar74 = _thresh[7];
  auVar147 = psubusb(auVar159,auVar257);
  auVar148 = psubusb(auVar257,auVar159);
  auVar148 = auVar148 | auVar147;
  bVar250 = -(auVar105[0] == '\0') ^ 0xff;
  bVar252 = -(auVar105[1] == '\0') ^ 0xff;
  bVar254 = -(auVar105[2] == '\0') ^ 0xff;
  bVar256 = -(auVar105[3] == '\0') ^ 0xff;
  bVar230 = -(auVar105[4] == '\0') ^ 0xff;
  bVar233 = -(auVar105[5] == '\0') ^ 0xff;
  bVar238 = -(auVar105[6] == '\0') ^ 0xff;
  bVar219 = -(auVar105[7] == '\0') ^ 0xff;
  bVar268 = auVar148[0];
  bVar104 = (bVar250 < bVar268) * bVar268 | (bVar250 >= bVar268) * bVar250;
  bVar270 = auVar148[1];
  bVar107 = (bVar252 < bVar270) * bVar270 | (bVar252 >= bVar270) * bVar252;
  bVar272 = auVar148[2];
  bVar109 = (bVar254 < bVar272) * bVar272 | (bVar254 >= bVar272) * bVar254;
  bVar273 = auVar148[3];
  bVar111 = (bVar256 < bVar273) * bVar273 | (bVar256 >= bVar273) * bVar256;
  bVar275 = auVar148[4];
  bVar232 = (bVar275 != 0) * bVar275;
  bVar276 = auVar148[5];
  bVar250 = (bVar276 != 0) * bVar276;
  bVar278 = auVar148[6];
  bVar252 = (bVar278 != 0) * bVar278;
  bVar279 = auVar148[7];
  bVar254 = (bVar279 != 0) * bVar279;
  bVar281 = auVar148[8];
  bVar117 = (bVar230 < bVar281) * bVar281 | (bVar230 >= bVar281) * bVar230;
  bVar282 = auVar148[9];
  bVar118 = (bVar233 < bVar282) * bVar282 | (bVar233 >= bVar282) * bVar233;
  bVar284 = auVar148[10];
  bVar119 = (bVar238 < bVar284) * bVar284 | (bVar238 >= bVar284) * bVar238;
  bVar12 = auVar148[0xb];
  bVar120 = (bVar219 < bVar12) * bVar12 | (bVar219 >= bVar12) * bVar219;
  bVar256 = (auVar148[0xc] != '\0') * auVar148[0xc];
  bVar230 = (auVar148[0xd] != '\0') * auVar148[0xd];
  bVar233 = (auVar148[0xe] != '\0') * auVar148[0xe];
  bVar238 = (auVar148[0xf] != '\0') * auVar148[0xf];
  auVar105 = psubusb(auVar121,auVar159);
  auVar147 = psubusb(auVar159,auVar121);
  auVar147 = auVar147 | auVar105;
  auVar105 = psubusb(auVar306,auVar121);
  auVar148 = psubusb(auVar121,auVar306);
  auVar148 = auVar148 | auVar105;
  bVar219 = auVar147[0];
  bVar218 = auVar148[0];
  bVar218 = (bVar218 < bVar219) * bVar219 | (bVar218 >= bVar219) * bVar218;
  bVar219 = auVar147[1];
  bVar224 = auVar148[1];
  bVar224 = (bVar224 < bVar219) * bVar219 | (bVar224 >= bVar219) * bVar224;
  bVar219 = auVar147[2];
  bVar225 = auVar148[2];
  bVar225 = (bVar225 < bVar219) * bVar219 | (bVar225 >= bVar219) * bVar225;
  bVar219 = auVar147[3];
  bVar229 = auVar148[3];
  bVar229 = (bVar229 < bVar219) * bVar219 | (bVar229 >= bVar219) * bVar229;
  bVar219 = auVar147[4];
  bVar231 = auVar148[4];
  bVar231 = (bVar231 < bVar219) * bVar219 | (bVar231 >= bVar219) * bVar231;
  bVar219 = auVar147[5];
  bVar237 = auVar148[5];
  bVar237 = (bVar237 < bVar219) * bVar219 | (bVar237 >= bVar219) * bVar237;
  bVar219 = auVar147[6];
  bVar239 = auVar148[6];
  bVar239 = (bVar239 < bVar219) * bVar219 | (bVar239 >= bVar219) * bVar239;
  bVar219 = auVar147[7];
  bVar244 = auVar148[7];
  bVar244 = (bVar244 < bVar219) * bVar219 | (bVar244 >= bVar219) * bVar244;
  bVar219 = auVar147[8];
  bVar245 = auVar148[8];
  bVar245 = (bVar245 < bVar219) * bVar219 | (bVar245 >= bVar219) * bVar245;
  bVar219 = auVar147[9];
  bVar246 = auVar148[9];
  bVar246 = (bVar246 < bVar219) * bVar219 | (bVar246 >= bVar219) * bVar246;
  bVar219 = auVar147[10];
  bVar247 = auVar148[10];
  bVar247 = (bVar247 < bVar219) * bVar219 | (bVar247 >= bVar219) * bVar247;
  bVar219 = auVar147[0xb];
  bVar248 = auVar148[0xb];
  bVar248 = (bVar248 < bVar219) * bVar219 | (bVar248 >= bVar219) * bVar248;
  bVar219 = auVar147[0xc];
  bVar249 = auVar148[0xc];
  bVar249 = (bVar249 < bVar219) * bVar219 | (bVar249 >= bVar219) * bVar249;
  bVar219 = auVar147[0xd];
  bVar251 = auVar148[0xd];
  bVar251 = (bVar251 < bVar219) * bVar219 | (bVar251 >= bVar219) * bVar251;
  bVar219 = auVar147[0xe];
  bVar253 = auVar148[0xe];
  bVar255 = auVar148[0xf];
  bVar253 = (bVar253 < bVar219) * bVar219 | (bVar253 >= bVar219) * bVar253;
  bVar219 = auVar147[0xf];
  bVar255 = (bVar255 < bVar219) * bVar219 | (bVar255 >= bVar219) * bVar255;
  bVar219 = (bVar218 < bVar104) * bVar104 | (bVar218 >= bVar104) * bVar218;
  bVar104 = (bVar224 < bVar107) * bVar107 | (bVar224 >= bVar107) * bVar224;
  bVar107 = (bVar225 < bVar109) * bVar109 | (bVar225 >= bVar109) * bVar225;
  bVar109 = (bVar229 < bVar111) * bVar111 | (bVar229 >= bVar111) * bVar229;
  bVar232 = (bVar231 < bVar232) * bVar232 | (bVar231 >= bVar232) * bVar231;
  bVar111 = (bVar237 < bVar250) * bVar250 | (bVar237 >= bVar250) * bVar237;
  bVar218 = (bVar239 < bVar252) * bVar252 | (bVar239 >= bVar252) * bVar239;
  bVar224 = (bVar244 < bVar254) * bVar254 | (bVar244 >= bVar254) * bVar244;
  bVar117 = (bVar245 < bVar117) * bVar117 | (bVar245 >= bVar117) * bVar245;
  bVar118 = (bVar246 < bVar118) * bVar118 | (bVar246 >= bVar118) * bVar246;
  bVar119 = (bVar247 < bVar119) * bVar119 | (bVar247 >= bVar119) * bVar247;
  bVar120 = (bVar248 < bVar120) * bVar120 | (bVar248 >= bVar120) * bVar248;
  bVar250 = (bVar249 < bVar256) * bVar256 | (bVar249 >= bVar256) * bVar249;
  bVar252 = (bVar251 < bVar230) * bVar230 | (bVar251 >= bVar230) * bVar251;
  bVar254 = (bVar253 < bVar233) * bVar233 | (bVar253 >= bVar233) * bVar253;
  bVar256 = (bVar255 < bVar238) * bVar238 | (bVar255 >= bVar238) * bVar255;
  bVar229 = (bVar232 < bVar219) * bVar219 | (bVar232 >= bVar219) * bVar232;
  bVar231 = (bVar111 < bVar104) * bVar104 | (bVar111 >= bVar104) * bVar111;
  bVar237 = (bVar218 < bVar107) * bVar107 | (bVar218 >= bVar107) * bVar218;
  bVar239 = (bVar224 < bVar109) * bVar109 | (bVar224 >= bVar109) * bVar224;
  bVar244 = (bVar117 < bVar232) * bVar232 | (bVar117 >= bVar232) * bVar117;
  bVar245 = (bVar118 < bVar111) * bVar111 | (bVar118 >= bVar111) * bVar118;
  bVar246 = (bVar119 < bVar218) * bVar218 | (bVar119 >= bVar218) * bVar119;
  bVar247 = (bVar120 < bVar224) * bVar224 | (bVar120 >= bVar224) * bVar120;
  bVar248 = (bVar250 < bVar117) * bVar117 | (bVar250 >= bVar117) * bVar250;
  bVar249 = (bVar252 < bVar118) * bVar118 | (bVar252 >= bVar118) * bVar252;
  bVar251 = (bVar254 < bVar119) * bVar119 | (bVar254 >= bVar119) * bVar254;
  bVar253 = (bVar256 < bVar120) * bVar120 | (bVar256 >= bVar120) * bVar256;
  bVar250 = (bVar250 != 0) * bVar250;
  bVar252 = (bVar252 != 0) * bVar252;
  bVar254 = (bVar254 != 0) * bVar254;
  bVar256 = (bVar256 != 0) * bVar256;
  bVar230 = *_limit;
  bVar233 = _limit[1];
  bVar238 = _limit[2];
  bVar232 = _limit[3];
  bVar219 = _limit[4];
  bVar104 = _limit[5];
  bVar107 = _limit[6];
  bVar109 = _limit[7];
  bVar111 = _limit[8];
  bVar117 = _limit[9];
  bVar118 = _limit[10];
  bVar119 = _limit[0xb];
  bVar120 = _limit[0xc];
  bVar218 = _limit[0xd];
  bVar224 = _limit[0xe];
  bVar225 = _limit[0xf];
  auVar184._0_4_ =
       CONCAT13(-((byte)((bVar239 < bVar232) * bVar239 | (bVar239 >= bVar232) * bVar232) == bVar239)
                ,CONCAT12(-((byte)((bVar237 < bVar238) * bVar237 | (bVar237 >= bVar238) * bVar238)
                           == bVar237),
                          CONCAT11(-((byte)((bVar231 < bVar233) * bVar231 |
                                           (bVar231 >= bVar233) * bVar233) == bVar231),
                                   -((byte)((bVar229 < bVar230) * bVar229 |
                                           (bVar229 >= bVar230) * bVar230) == bVar229))));
  auVar184[4] = -((byte)((bVar244 < bVar219) * bVar244 | (bVar244 >= bVar219) * bVar219) == bVar244)
  ;
  auVar184[5] = -((byte)((bVar245 < bVar104) * bVar245 | (bVar245 >= bVar104) * bVar104) == bVar245)
  ;
  auVar184[6] = -((byte)((bVar246 < bVar107) * bVar246 | (bVar246 >= bVar107) * bVar107) == bVar246)
  ;
  auVar184[7] = -((byte)((bVar247 < bVar109) * bVar247 | (bVar247 >= bVar109) * bVar109) == bVar247)
  ;
  auVar184[8] = -((byte)((bVar248 < bVar111) * bVar248 | (bVar248 >= bVar111) * bVar111) == bVar248)
  ;
  auVar184[9] = -((byte)((bVar249 < bVar117) * bVar249 | (bVar249 >= bVar117) * bVar117) == bVar249)
  ;
  auVar184[10] = -((byte)((bVar251 < bVar118) * bVar251 | (bVar251 >= bVar118) * bVar118) == bVar251
                  );
  auVar184[0xb] =
       -((byte)((bVar253 < bVar119) * bVar253 | (bVar253 >= bVar119) * bVar119) == bVar253);
  auVar184[0xc] =
       -((byte)((bVar250 < bVar120) * bVar250 | (bVar250 >= bVar120) * bVar120) == bVar250);
  auVar184[0xd] =
       -((byte)((bVar252 < bVar218) * bVar252 | (bVar252 >= bVar218) * bVar218) == bVar252);
  auVar184[0xe] =
       -((byte)((bVar254 < bVar224) * bVar254 | (bVar254 >= bVar224) * bVar224) == bVar254);
  auVar184[0xf] =
       -((byte)((bVar256 < bVar225) * bVar256 | (bVar256 >= bVar225) * bVar225) == bVar256);
  auVar105 = psubusb(auVar121,auVar257);
  auVar147 = psubusb(auVar257,auVar121);
  auVar147 = auVar147 | auVar105;
  auVar105 = psubusb(auVar306,auVar257);
  auVar148 = psubusb(auVar257,auVar306);
  auVar148 = auVar148 | auVar105;
  bVar250 = auVar147[0];
  bVar252 = auVar148[0];
  bVar252 = (bVar252 < bVar250) * bVar250 | (bVar252 >= bVar250) * bVar252;
  bVar250 = auVar147[1];
  bVar254 = auVar148[1];
  bVar254 = (bVar254 < bVar250) * bVar250 | (bVar254 >= bVar250) * bVar254;
  bVar250 = auVar147[2];
  bVar256 = auVar148[2];
  bVar256 = (bVar256 < bVar250) * bVar250 | (bVar256 >= bVar250) * bVar256;
  bVar250 = auVar147[3];
  bVar230 = auVar148[3];
  bVar230 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
  bVar250 = auVar147[4];
  bVar233 = auVar148[4];
  bVar233 = (bVar233 < bVar250) * bVar250 | (bVar233 >= bVar250) * bVar233;
  bVar250 = auVar147[5];
  bVar238 = auVar148[5];
  bVar238 = (bVar238 < bVar250) * bVar250 | (bVar238 >= bVar250) * bVar238;
  bVar250 = auVar147[6];
  bVar232 = auVar148[6];
  bVar232 = (bVar232 < bVar250) * bVar250 | (bVar232 >= bVar250) * bVar232;
  bVar250 = auVar147[7];
  bVar219 = auVar148[7];
  bVar219 = (bVar219 < bVar250) * bVar250 | (bVar219 >= bVar250) * bVar219;
  bVar250 = (bVar252 < bVar268) * bVar268 | (bVar252 >= bVar268) * bVar252;
  bVar252 = (bVar254 < bVar270) * bVar270 | (bVar254 >= bVar270) * bVar254;
  bVar254 = (bVar256 < bVar272) * bVar272 | (bVar256 >= bVar272) * bVar256;
  bVar256 = (bVar230 < bVar273) * bVar273 | (bVar230 >= bVar273) * bVar230;
  bVar230 = (bVar233 < bVar275) * bVar275 | (bVar233 >= bVar275) * bVar233;
  bVar233 = (bVar238 < bVar276) * bVar276 | (bVar238 >= bVar276) * bVar238;
  bVar238 = (bVar232 < bVar278) * bVar278 | (bVar232 >= bVar278) * bVar232;
  bVar232 = (bVar219 < bVar279) * bVar279 | (bVar219 >= bVar279) * bVar219;
  bVar250 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
  bVar252 = (bVar233 < bVar252) * bVar252 | (bVar233 >= bVar252) * bVar233;
  bVar254 = (bVar238 < bVar254) * bVar254 | (bVar238 >= bVar254) * bVar238;
  bVar256 = (bVar232 < bVar256) * bVar256 | (bVar232 >= bVar256) * bVar232;
  uVar197 = CONCAT13(-((byte)((bVar256 == 0) * bVar256 | bVar256 != 0) == bVar256),
                     CONCAT12(-((byte)((bVar254 == 0) * bVar254 | bVar254 != 0) == bVar254),
                              CONCAT11(-((byte)((bVar252 == 0) * bVar252 | bVar252 != 0) == bVar252)
                                       ,-((byte)((bVar250 == 0) * bVar250 | bVar250 != 0) == bVar250
                                         )))) & auVar184._0_4_;
  auVar223._0_8_ = CONCAT44(uVar197,uVar197);
  auVar223._8_4_ = uVar197;
  auVar223._12_4_ = uVar197;
  cVar108 = (char)uVar197;
  auVar147[0] = -(cVar108 == '\0');
  cVar110 = (char)(uVar197 >> 8);
  auVar147[1] = -(cVar110 == '\0');
  cVar112 = (char)(uVar197 >> 0x10);
  auVar147[2] = -(cVar112 == '\0');
  cVar113 = (char)(uVar197 >> 0x18);
  auVar147[3] = -(cVar113 == '\0');
  auVar147[4] = -(cVar108 == '\0');
  auVar147[5] = -(cVar110 == '\0');
  auVar147[6] = -(cVar112 == '\0');
  auVar147[7] = -(cVar113 == '\0');
  auVar147[8] = -(cVar108 == '\0');
  auVar147[9] = -(cVar110 == '\0');
  auVar147[10] = -(cVar112 == '\0');
  auVar147[0xb] = -(cVar113 == '\0');
  auVar147[0xc] = -(cVar108 == '\0');
  auVar147[0xd] = -(cVar110 == '\0');
  auVar147[0xe] = -(cVar112 == '\0');
  auVar147[0xf] = -(cVar113 == '\0');
  uVar11 = *(undefined4 *)(s + lVar103 * 4);
  auVar266._0_8_ = CONCAT44(uVar11,uVar1);
  auVar266._8_8_ = 0;
  bVar250 = (bVar275 < bVar268) * bVar268 | (bVar275 >= bVar268) * bVar275;
  bVar252 = (bVar276 < bVar270) * bVar270 | (bVar276 >= bVar270) * bVar276;
  bVar254 = (bVar278 < bVar272) * bVar272 | (bVar278 >= bVar272) * bVar278;
  bVar256 = (bVar279 < bVar273) * bVar273 | (bVar279 >= bVar273) * bVar279;
  bVar230 = (bVar281 < bVar275) * bVar275 | (bVar281 >= bVar275) * bVar281;
  bVar233 = (bVar282 < bVar276) * bVar276 | (bVar282 >= bVar276) * bVar282;
  bVar238 = (bVar284 < bVar278) * bVar278 | (bVar284 >= bVar278) * bVar284;
  bVar232 = (bVar12 < bVar279) * bVar279 | (bVar12 >= bVar279) * bVar12;
  uVar197 = CONCAT13(-((byte)((bVar256 < bVar70) * bVar256 | (bVar256 >= bVar70) * bVar70) ==
                      bVar256),
                     CONCAT12(-((byte)((bVar254 < bVar69) * bVar254 | (bVar254 >= bVar69) * bVar69)
                               == bVar254),
                              CONCAT11(-((byte)((bVar252 < bVar68) * bVar252 |
                                               (bVar252 >= bVar68) * bVar68) == bVar252),
                                       -((byte)((bVar250 < bVar67) * bVar250 |
                                               (bVar250 >= bVar67) * bVar67) == bVar250))));
  auVar105 = psubsb(auVar130 ^ _DAT_00c1e160,auVar166 ^ _DAT_00c1e160);
  uVar151 = (undefined4)
            (CONCAT17(-((byte)((bVar232 < bVar74) * bVar232 | (bVar232 >= bVar74) * bVar74) ==
                       bVar232),
                      CONCAT16(-((byte)((bVar238 < bVar73) * bVar238 | (bVar238 >= bVar73) * bVar73)
                                == bVar238),
                               CONCAT15(-((byte)((bVar233 < bVar72) * bVar233 |
                                                (bVar233 >= bVar72) * bVar72) == bVar233),
                                        CONCAT14(-((byte)((bVar230 < bVar71) * bVar230 |
                                                         (bVar230 >= bVar71) * bVar71) == bVar230),
                                                 uVar197)))) >> 0x20);
  auVar199._4_4_ = uVar197;
  auVar199._0_4_ = uVar197;
  auVar199._8_4_ = uVar151;
  auVar199._12_4_ = uVar151;
  uVar151 = *(undefined4 *)(s + lVar103 * 5);
  auVar148 = psubsb(~auVar199 & auVar105 >> 0x20,auVar105);
  auVar148 = psubsb(auVar148,auVar105);
  auVar105 = psubsb(auVar148,auVar105);
  uVar198 = SUB164(auVar105 & auVar184,0);
  uVar204 = SUB164(auVar105 & auVar184,4);
  auVar148._4_4_ = uVar198;
  auVar148._0_4_ = uVar198;
  auVar148._8_4_ = uVar204;
  auVar148._12_4_ = uVar204;
  auVar105 = paddsb(auVar148,_DAT_00d458e0);
  auVar288._0_8_ = CONCAT44(uVar151,uVar7);
  uVar305 = (undefined1)((uint)uVar151 >> 0x18);
  auVar294._8_6_ = 0;
  auVar294._0_8_ = auVar288._0_8_;
  auVar294[0xe] = uVar305;
  auVar294[0xf] = auVar105[7];
  auVar293._14_2_ = auVar294._14_2_;
  auVar293._8_5_ = 0;
  auVar293._0_8_ = auVar288._0_8_;
  auVar293[0xd] = auVar105[6];
  uVar304 = (undefined1)((uint)uVar151 >> 0x10);
  auVar292._13_3_ = auVar293._13_3_;
  auVar292._8_4_ = 0;
  auVar292._0_8_ = auVar288._0_8_;
  auVar292[0xc] = uVar304;
  auVar291._12_4_ = auVar292._12_4_;
  auVar291._8_3_ = 0;
  auVar291._0_8_ = auVar288._0_8_;
  auVar291[0xb] = auVar105[5];
  uVar303 = (undefined1)((uint)uVar151 >> 8);
  auVar290._11_5_ = auVar291._11_5_;
  auVar290._8_2_ = 0;
  auVar290._0_8_ = auVar288._0_8_;
  auVar290[10] = uVar303;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289[8] = 0;
  auVar289._0_8_ = auVar288._0_8_;
  auVar289[9] = auVar105[4];
  auVar288._9_7_ = auVar289._9_7_;
  auVar288[8] = (char)uVar151;
  auVar287._8_8_ = auVar288._8_8_;
  auVar287[7] = auVar105[3];
  uVar302 = (undefined1)((uint)uVar7 >> 0x18);
  auVar287[6] = uVar302;
  auVar287[5] = auVar105[2];
  uVar301 = (undefined1)((uint)uVar7 >> 0x10);
  auVar287[4] = uVar301;
  auVar287._0_4_ = uVar7;
  auVar286._4_12_ = auVar287._4_12_;
  auVar286[3] = auVar105[1];
  uVar300 = (undefined1)((uint)uVar7 >> 8);
  auVar286[2] = uVar300;
  auVar286[0] = (undefined1)uVar7;
  auVar286[1] = auVar105[0];
  auVar105 = psraw(auVar286,0xb);
  auVar148 = packsswb(auVar105,auVar105);
  auVar106[0] = auVar148[0] + '\x01';
  cVar108 = auVar148[1] + '\x01';
  cVar110 = auVar148[2] + '\x01';
  cVar112 = auVar148[3] + '\x01';
  cVar113 = auVar148[4] + '\x01';
  cVar114 = auVar148[5] + '\x01';
  cVar115 = auVar148[6] + '\x01';
  cVar116 = auVar148[7] + '\x01';
  auVar106._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar116,cVar116),cVar115),
                                                     cVar115),cVar114),cVar114),cVar113),
                 CONCAT11(cVar113,cVar116)) >> 8);
  auVar106[7] = cVar112;
  auVar106[6] = cVar112;
  auVar106[5] = cVar110;
  auVar106[4] = cVar110;
  auVar106[3] = cVar108;
  auVar106[2] = cVar108;
  auVar106[1] = auVar106[0];
  auVar105 = psraw(auVar106,9);
  auVar105 = packsswb(auVar105,auVar105);
  uVar197 = auVar105._0_4_ & uVar197;
  auVar296._0_8_ = auVar148._0_8_;
  auVar296._8_4_ = auVar148._4_4_;
  auVar296._12_4_ = uVar197;
  auVar295._8_8_ = auVar296._8_8_;
  auVar295._0_4_ = auVar148._0_4_;
  auVar295._4_4_ = uVar197;
  auVar105 = psubsb(auVar166 ^ _DAT_00c1e160,auVar295);
  auVar297._8_8_ = 0;
  auVar297._0_8_ = auVar295._8_8_;
  auVar148 = paddsb(auVar297,auVar130 ^ _DAT_00c1e160);
  auVar299._0_8_ = auVar148._0_8_;
  auVar299._8_4_ = auVar148._4_4_;
  auVar299._12_4_ = auVar105._4_4_;
  auVar298._8_8_ = auVar299._8_8_;
  auVar298._0_4_ = auVar148._0_4_;
  auVar298._4_4_ = auVar105._0_4_;
  uVar285 = SUB168(auVar298 ^ _DAT_00c1e160,0);
  uVar307 = SUB168(auVar298 ^ _DAT_00c1e160,8);
  if ((ushort)((ushort)(SUB161(auVar147 >> 7,0) & 1) | (ushort)(SUB161(auVar147 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar147 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar147 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar147 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar147 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar147 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar147 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar147 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar147 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar147 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar147 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar147 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar147 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar147 >> 0x77,0) & 1) << 0xe | (ushort)(auVar147[0xf] >> 7) << 0xf
              ) != 0xffff) {
    uVar198 = *(undefined4 *)(s + -(long)(p * 7));
    uVar204 = *(undefined4 *)(s + lVar103 * 6);
    local_f8._0_8_ = CONCAT44(uVar204,uVar198);
    local_f8._8_8_ = 0;
    auVar13._8_6_ = 0;
    auVar13._0_8_ = auVar257._0_8_;
    auVar13[0xe] = (char)((uint)uVar10 >> 0x18);
    uVar217 = auVar13._13_2_;
    auVar20._8_4_ = 0;
    auVar20._0_8_ = auVar257._0_8_;
    auVar20[0xc] = (char)((uint)uVar10 >> 0x10);
    auVar20._13_2_ = uVar217;
    auVar27._8_4_ = 0;
    auVar27._0_8_ = auVar257._0_8_;
    auVar27._12_3_ = auVar20._12_3_;
    auVar34._8_2_ = 0;
    auVar34._0_8_ = auVar257._0_8_;
    auVar34[10] = (char)((uint)uVar10 >> 8);
    auVar34._11_4_ = auVar27._11_4_;
    auVar41._8_2_ = 0;
    auVar41._0_8_ = auVar257._0_8_;
    auVar41._10_5_ = auVar34._10_5_;
    auVar48[8] = (char)uVar10;
    auVar48._0_8_ = auVar257._0_8_;
    auVar48._9_6_ = auVar41._9_6_;
    auVar76._7_8_ = 0;
    auVar76._0_7_ = auVar48._8_7_;
    Var77 = CONCAT81(SUB158(auVar76 << 0x40,7),(char)((uint)uVar6 >> 0x18));
    auVar94._9_6_ = 0;
    auVar94._0_9_ = Var77;
    auVar55[4] = (char)((uint)uVar6 >> 0x10);
    auVar55._0_4_ = uVar6;
    auVar55._5_10_ = SUB1510(auVar94 << 0x30,5);
    auVar78._11_4_ = 0;
    auVar78._0_11_ = auVar55._4_11_;
    auVar60[2] = (char)((uint)uVar6 >> 8);
    auVar60._0_2_ = (ushort)uVar6;
    auVar60._3_12_ = SUB1512(auVar78 << 0x20,3);
    uVar209 = (ushort)uVar6 & 0xff;
    auVar14._8_6_ = 0;
    auVar14._0_8_ = auVar159._0_8_;
    auVar14[0xe] = (char)((uint)uVar9 >> 0x18);
    uVar153 = auVar14._13_2_;
    auVar21._8_4_ = 0;
    auVar21._0_8_ = auVar159._0_8_;
    auVar21[0xc] = (char)((uint)uVar9 >> 0x10);
    auVar21._13_2_ = uVar153;
    auVar28._8_4_ = 0;
    auVar28._0_8_ = auVar159._0_8_;
    auVar28._12_3_ = auVar21._12_3_;
    auVar35._8_2_ = 0;
    auVar35._0_8_ = auVar159._0_8_;
    auVar35[10] = (char)((uint)uVar9 >> 8);
    auVar35._11_4_ = auVar28._11_4_;
    auVar42._8_2_ = 0;
    auVar42._0_8_ = auVar159._0_8_;
    auVar42._10_5_ = auVar35._10_5_;
    auVar49[8] = (char)uVar9;
    auVar49._0_8_ = auVar159._0_8_;
    auVar49._9_6_ = auVar42._9_6_;
    auVar79._7_8_ = 0;
    auVar79._0_7_ = auVar49._8_7_;
    Var80 = CONCAT81(SUB158(auVar79 << 0x40,7),(char)((uint)uVar5 >> 0x18));
    auVar95._9_6_ = 0;
    auVar95._0_9_ = Var80;
    auVar56[4] = (char)((uint)uVar5 >> 0x10);
    auVar56._0_4_ = uVar5;
    auVar56._5_10_ = SUB1510(auVar95 << 0x30,5);
    auVar81._11_4_ = 0;
    auVar81._0_11_ = auVar56._4_11_;
    auVar61[2] = (char)((uint)uVar5 >> 8);
    auVar61._0_2_ = (ushort)uVar5;
    auVar61._3_12_ = SUB1512(auVar81 << 0x20,3);
    uVar158 = (ushort)uVar5 & 0xff;
    auVar15._8_6_ = 0;
    auVar15._0_8_ = auVar121._0_8_;
    auVar15[0xe] = (char)((uint)uVar8 >> 0x18);
    uVar162 = auVar15._13_2_;
    auVar22._8_4_ = 0;
    auVar22._0_8_ = auVar121._0_8_;
    auVar22[0xc] = (char)((uint)uVar8 >> 0x10);
    auVar22._13_2_ = uVar162;
    auVar29._8_4_ = 0;
    auVar29._0_8_ = auVar121._0_8_;
    auVar29._12_3_ = auVar22._12_3_;
    auVar36._8_2_ = 0;
    auVar36._0_8_ = auVar121._0_8_;
    auVar36[10] = (char)((uint)uVar8 >> 8);
    auVar36._11_4_ = auVar29._11_4_;
    auVar43._8_2_ = 0;
    auVar43._0_8_ = auVar121._0_8_;
    auVar43._10_5_ = auVar36._10_5_;
    auVar50[8] = (char)uVar8;
    auVar50._0_8_ = auVar121._0_8_;
    auVar50._9_6_ = auVar43._9_6_;
    auVar82._7_8_ = 0;
    auVar82._0_7_ = auVar50._8_7_;
    Var83 = CONCAT81(SUB158(auVar82 << 0x40,7),(char)((uint)uVar4 >> 0x18));
    auVar96._9_6_ = 0;
    auVar96._0_9_ = Var83;
    auVar57[4] = (char)((uint)uVar4 >> 0x10);
    auVar57._0_4_ = uVar4;
    auVar57._5_10_ = SUB1510(auVar96 << 0x30,5);
    auVar84._11_4_ = 0;
    auVar84._0_11_ = auVar57._4_11_;
    auVar62[2] = (char)((uint)uVar4 >> 8);
    auVar62._0_2_ = (ushort)uVar4;
    auVar62._3_12_ = SUB1512(auVar84 << 0x20,3);
    uVar146 = (ushort)uVar4 & 0xff;
    auVar16._8_6_ = 0;
    auVar16._0_8_ = auVar306._0_8_;
    auVar16[0xe] = (char)((uint)uVar3 >> 0x18);
    uVar283 = auVar16._13_2_;
    auVar23._8_4_ = 0;
    auVar23._0_8_ = auVar306._0_8_;
    auVar23[0xc] = (char)((uint)uVar3 >> 0x10);
    auVar23._13_2_ = uVar283;
    auVar30._8_4_ = 0;
    auVar30._0_8_ = auVar306._0_8_;
    auVar30._12_3_ = auVar23._12_3_;
    auVar37._8_2_ = 0;
    auVar37._0_8_ = auVar306._0_8_;
    auVar37[10] = (char)((uint)uVar3 >> 8);
    auVar37._11_4_ = auVar30._11_4_;
    auVar44._8_2_ = 0;
    auVar44._0_8_ = auVar306._0_8_;
    auVar44._10_5_ = auVar37._10_5_;
    auVar51[8] = (char)uVar3;
    auVar51._0_8_ = auVar306._0_8_;
    auVar51._9_6_ = auVar44._9_6_;
    auVar85._7_8_ = 0;
    auVar85._0_7_ = auVar51._8_7_;
    Var86 = CONCAT81(SUB158(auVar85 << 0x40,7),(char)((uint)uVar2 >> 0x18));
    auVar97._9_6_ = 0;
    auVar97._0_9_ = Var86;
    auVar58[4] = (char)((uint)uVar2 >> 0x10);
    auVar58._0_4_ = uVar2;
    auVar58._5_10_ = SUB1510(auVar97 << 0x30,5);
    auVar87._11_4_ = 0;
    auVar87._0_11_ = auVar58._4_11_;
    auVar63[2] = (char)((uint)uVar2 >> 8);
    auVar63._0_2_ = (ushort)uVar2;
    auVar63._3_12_ = SUB1512(auVar87 << 0x20,3);
    uVar160 = (ushort)uVar2 & 0xff;
    sVar132 = auVar61._2_2_;
    sVar149 = auVar62._2_2_;
    sVar134 = auVar56._4_2_;
    sVar150 = auVar57._4_2_;
    sVar136 = (short)Var80;
    sVar152 = (short)Var83;
    sVar138 = auVar49._8_2_;
    sVar154 = auVar50._8_2_;
    sVar140 = auVar35._10_2_;
    sVar155 = auVar36._10_2_;
    sVar142 = auVar21._12_2_;
    sVar156 = auVar22._12_2_;
    sVar144 = (uVar153 >> 8) + (uVar162 >> 8);
    sVar128 = uVar158 + uVar146 + uVar209;
    sVar200 = auVar60._2_2_;
    sVar133 = sVar132 + sVar149 + sVar200;
    sVar202 = auVar55._4_2_;
    sVar135 = sVar134 + sVar150 + sVar202;
    sVar205 = (short)Var77;
    sVar137 = sVar136 + sVar152 + sVar205;
    sVar207 = auVar48._8_2_;
    sVar139 = sVar138 + sVar154 + sVar207;
    sVar210 = auVar34._10_2_;
    sVar141 = sVar140 + sVar155 + sVar210;
    sVar213 = auVar20._12_2_;
    sVar143 = sVar142 + sVar156 + sVar213;
    sVar145 = sVar144 + (uVar217 >> 8);
    sVar177 = sVar139 + sVar128 + 4;
    sVar178 = sVar141 + sVar133 + 4;
    sVar179 = sVar143 + sVar135 + 4;
    sVar180 = sVar145 + sVar137 + 4;
    sVar122 = auVar63._2_2_;
    sVar123 = auVar58._4_2_;
    sVar124 = (short)Var86;
    sVar125 = auVar51._8_2_;
    sVar126 = auVar37._10_2_;
    sVar127 = auVar23._12_2_;
    sVar181 = sVar180 - (uVar162 >> 8);
    auVar105 = psubusb(auVar266,auVar257);
    auVar147 = psubusb(auVar257,auVar266);
    auVar147 = auVar147 | auVar105;
    auVar75._8_8_ = 0;
    auVar75._0_8_ = auVar288._0_8_;
    auVar105 = psubusb(auVar75,auVar257);
    auVar148 = psubusb(auVar257,auVar75);
    auVar148 = auVar148 | auVar105;
    bVar250 = auVar147[0];
    bVar252 = auVar148[0];
    bVar252 = (bVar252 < bVar250) * bVar250 | (bVar252 >= bVar250) * bVar252;
    bVar250 = auVar147[1];
    bVar254 = auVar148[1];
    bVar254 = (bVar254 < bVar250) * bVar250 | (bVar254 >= bVar250) * bVar254;
    bVar250 = auVar147[2];
    bVar256 = auVar148[2];
    bVar256 = (bVar256 < bVar250) * bVar250 | (bVar256 >= bVar250) * bVar256;
    bVar250 = auVar147[3];
    bVar230 = auVar148[3];
    bVar232 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[4];
    bVar230 = auVar148[4];
    bVar268 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[5];
    bVar230 = auVar148[5];
    bVar219 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[6];
    bVar230 = auVar148[6];
    bVar270 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[7];
    bVar230 = auVar148[7];
    bVar272 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[8];
    bVar230 = auVar148[8];
    bVar273 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[9];
    bVar230 = auVar148[9];
    bVar275 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[10];
    bVar230 = auVar148[10];
    bVar276 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[0xb];
    bVar230 = auVar148[0xb];
    bVar278 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[0xc];
    bVar230 = auVar148[0xc];
    bVar279 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[0xd];
    bVar230 = auVar148[0xd];
    bVar281 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[0xe];
    bVar230 = auVar148[0xe];
    bVar233 = auVar148[0xf];
    bVar282 = (bVar230 < bVar250) * bVar250 | (bVar230 >= bVar250) * bVar230;
    bVar250 = auVar147[0xf];
    bVar284 = (bVar233 < bVar250) * bVar250 | (bVar233 >= bVar250) * bVar233;
    auVar105 = psubusb(local_f8,auVar257);
    auVar147 = psubusb(auVar257,local_f8);
    auVar147 = auVar147 | auVar105;
    bVar250 = auVar147[0];
    bVar230 = (bVar250 < bVar252) * bVar252 | (bVar250 >= bVar252) * bVar250;
    bVar250 = auVar147[1];
    bVar233 = (bVar250 < bVar254) * bVar254 | (bVar250 >= bVar254) * bVar250;
    bVar250 = auVar147[2];
    bVar238 = (bVar250 < bVar256) * bVar256 | (bVar250 >= bVar256) * bVar250;
    bVar250 = auVar147[3];
    bVar232 = (bVar250 < bVar232) * bVar232 | (bVar250 >= bVar232) * bVar250;
    bVar250 = auVar147[4];
    bVar268 = (bVar250 < bVar268) * bVar268 | (bVar250 >= bVar268) * bVar250;
    bVar250 = auVar147[5];
    bVar219 = (bVar250 < bVar219) * bVar219 | (bVar250 >= bVar219) * bVar250;
    bVar250 = auVar147[6];
    bVar270 = (bVar250 < bVar270) * bVar270 | (bVar250 >= bVar270) * bVar250;
    bVar250 = auVar147[7];
    bVar272 = (bVar250 < bVar272) * bVar272 | (bVar250 >= bVar272) * bVar250;
    bVar250 = auVar147[8];
    bVar273 = (bVar250 < bVar273) * bVar273 | (bVar250 >= bVar273) * bVar250;
    bVar250 = auVar147[9];
    bVar275 = (bVar250 < bVar275) * bVar275 | (bVar250 >= bVar275) * bVar250;
    bVar250 = auVar147[10];
    bVar276 = (bVar250 < bVar276) * bVar276 | (bVar250 >= bVar276) * bVar250;
    bVar250 = auVar147[0xb];
    bVar278 = (bVar250 < bVar278) * bVar278 | (bVar250 >= bVar278) * bVar250;
    bVar250 = auVar147[0xc];
    bVar250 = (bVar250 < bVar279) * bVar279 | (bVar250 >= bVar279) * bVar250;
    bVar252 = auVar147[0xd];
    bVar256 = (bVar252 < bVar281) * bVar281 | (bVar252 >= bVar281) * bVar252;
    bVar252 = auVar147[0xe];
    bVar279 = auVar147[0xf];
    bVar254 = (bVar252 < bVar282) * bVar282 | (bVar252 >= bVar282) * bVar252;
    bVar252 = (bVar279 < bVar284) * bVar284 | (bVar279 >= bVar284) * bVar279;
    bVar230 = (bVar268 < bVar230) * bVar230 | (bVar268 >= bVar230) * bVar268;
    bVar233 = (bVar219 < bVar233) * bVar233 | (bVar219 >= bVar233) * bVar219;
    bVar238 = (bVar270 < bVar238) * bVar238 | (bVar270 >= bVar238) * bVar270;
    bVar232 = (bVar272 < bVar232) * bVar232 | (bVar272 >= bVar232) * bVar272;
    bVar268 = (bVar273 < bVar268) * bVar268 | (bVar273 >= bVar268) * bVar273;
    bVar219 = (bVar275 < bVar219) * bVar219 | (bVar275 >= bVar219) * bVar275;
    bVar270 = (bVar276 < bVar270) * bVar270 | (bVar276 >= bVar270) * bVar276;
    bVar272 = (bVar278 < bVar272) * bVar272 | (bVar278 >= bVar272) * bVar278;
    bVar273 = (bVar250 < bVar273) * bVar273 | (bVar250 >= bVar273) * bVar250;
    bVar275 = (bVar256 < bVar275) * bVar275 | (bVar256 >= bVar275) * bVar256;
    bVar276 = (bVar254 < bVar276) * bVar276 | (bVar254 >= bVar276) * bVar254;
    bVar278 = (bVar252 < bVar278) * bVar278 | (bVar252 >= bVar278) * bVar252;
    bVar250 = (bVar250 != 0) * bVar250;
    bVar256 = (bVar256 != 0) * bVar256;
    bVar254 = (bVar254 != 0) * bVar254;
    bVar252 = (bVar252 != 0) * bVar252;
    auVar185[0] = -((byte)((bVar230 == 0) * bVar230 | bVar230 != 0) == bVar230);
    auVar185[1] = -((byte)((bVar233 == 0) * bVar233 | bVar233 != 0) == bVar233);
    auVar185[2] = -((byte)((bVar238 == 0) * bVar238 | bVar238 != 0) == bVar238);
    auVar185[3] = -((byte)((bVar232 == 0) * bVar232 | bVar232 != 0) == bVar232);
    auVar185[4] = -((byte)((bVar268 == 0) * bVar268 | bVar268 != 0) == bVar268);
    auVar185[5] = -((byte)((bVar219 == 0) * bVar219 | bVar219 != 0) == bVar219);
    auVar185[6] = -((byte)((bVar270 == 0) * bVar270 | bVar270 != 0) == bVar270);
    auVar185[7] = -((byte)((bVar272 == 0) * bVar272 | bVar272 != 0) == bVar272);
    auVar185[8] = -((byte)((bVar273 == 0) * bVar273 | bVar273 != 0) == bVar273);
    auVar185[9] = -((byte)((bVar275 == 0) * bVar275 | bVar275 != 0) == bVar275);
    auVar185[10] = -((byte)((bVar276 == 0) * bVar276 | bVar276 != 0) == bVar276);
    auVar185[0xb] = -((byte)((bVar278 == 0) * bVar278 | bVar278 != 0) == bVar278);
    auVar185[0xc] = -((byte)((bVar250 == 0) * bVar250 | bVar250 != 0) == bVar250);
    auVar185[0xd] = -((byte)((bVar256 == 0) * bVar256 | bVar256 != 0) == bVar256);
    auVar185[0xe] = -((byte)((bVar254 == 0) * bVar254 | bVar254 != 0) == bVar254);
    auVar185[0xf] = -((byte)((bVar252 == 0) * bVar252 | bVar252 != 0) == bVar252);
    uVar196 = (ushort)(uVar209 + uVar160 + sVar177) >> 3;
    uVar201 = (ushort)(sVar200 + sVar122 + sVar178) >> 3;
    uVar203 = (ushort)(sVar202 + sVar123 + sVar179) >> 3;
    uVar206 = (ushort)(sVar205 + sVar124 + sVar180) >> 3;
    uVar208 = (ushort)(sVar207 + sVar125 + sVar177) >> 3;
    uVar211 = (ushort)(sVar210 + sVar126 + sVar178) >> 3;
    uVar214 = (ushort)(sVar213 + sVar127 + sVar179) >> 3;
    uVar216 = (ushort)((uVar217 >> 8) + (uVar283 >> 8) + sVar180) >> 3;
    uVar285 = CONCAT17((uVar216 != 0) * (uVar216 < 0x100) * (char)uVar216 - (0xff < uVar216),
                       CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                (0xff < uVar214),
                                CONCAT15((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 -
                                         (0xff < uVar211),
                                         CONCAT14((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208
                                                  - (0xff < uVar208),
                                                  CONCAT13((uVar206 != 0) * (uVar206 < 0x100) *
                                                           (char)uVar206 - (0xff < uVar206),
                                                           CONCAT12((uVar203 != 0) *
                                                                    (uVar203 < 0x100) *
                                                                    (char)uVar203 - (0xff < uVar203)
                                                                    ,CONCAT11((uVar201 != 0) *
                                                                              (uVar201 < 0x100) *
                                                                              (char)uVar201 -
                                                                              (0xff < uVar201),
                                                                              (uVar196 != 0) *
                                                                              (uVar196 < 0x100) *
                                                                              (char)uVar196 -
                                                                              (0xff < uVar196)))))))
                      ) & auVar223._0_8_ | ~auVar223._0_8_ & uVar285;
    uVar196 = (ushort)((sVar177 - sVar154) + uVar160 * 2 + uVar158) >> 3;
    uVar201 = (ushort)((sVar178 - sVar155) + sVar122 * 2 + sVar132) >> 3;
    uVar203 = (ushort)((sVar179 - sVar156) + sVar123 * 2 + sVar134) >> 3;
    uVar206 = (ushort)(sVar181 + sVar124 * 2 + sVar136) >> 3;
    uVar208 = (ushort)((sVar177 - uVar146) + sVar125 * 2 + sVar138) >> 3;
    uVar211 = (ushort)((sVar178 - sVar149) + sVar126 * 2 + sVar140) >> 3;
    uVar214 = (ushort)((sVar179 - sVar150) + sVar127 * 2 + sVar142) >> 3;
    uVar216 = (ushort)((sVar180 - sVar152) + (uVar283 >> 8) * 2 + (uVar153 >> 8)) >> 3;
    uVar307 = CONCAT17((uVar216 != 0) * (uVar216 < 0x100) * (char)uVar216 - (0xff < uVar216),
                       CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                (0xff < uVar214),
                                CONCAT15((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 -
                                         (0xff < uVar211),
                                         CONCAT14((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208
                                                  - (0xff < uVar208),
                                                  CONCAT13((uVar206 != 0) * (uVar206 < 0x100) *
                                                           (char)uVar206 - (0xff < uVar206),
                                                           CONCAT12((uVar203 != 0) *
                                                                    (uVar203 < 0x100) *
                                                                    (char)uVar203 - (0xff < uVar203)
                                                                    ,CONCAT11((uVar201 != 0) *
                                                                              (uVar201 < 0x100) *
                                                                              (char)uVar201 -
                                                                              (0xff < uVar201),
                                                                              (uVar196 != 0) *
                                                                              (uVar196 < 0x100) *
                                                                              (char)uVar196 -
                                                                              (0xff < uVar196)))))))
                      ) & auVar223._0_8_ | ~auVar223._0_8_ & uVar307;
    uVar196 = (ushort)(((uVar160 * 3 + uVar146) - sVar138) + (sVar177 - sVar154)) >> 3;
    uVar201 = (ushort)(((sVar122 * 3 + sVar149) - sVar140) + (sVar178 - sVar155)) >> 3;
    uVar203 = (ushort)(((sVar123 * 3 + sVar150) - sVar142) + (sVar179 - sVar156)) >> 3;
    uVar206 = (ushort)(((sVar124 * 3 + sVar152) - (uVar153 >> 8)) + sVar181) >> 3;
    uVar208 = (ushort)(((sVar125 * 3 + sVar154) - uVar158) + (sVar177 - uVar146)) >> 3;
    uVar211 = (ushort)(((sVar126 * 3 + sVar155) - sVar132) + (sVar178 - sVar149)) >> 3;
    uVar214 = (ushort)(((sVar127 * 3 + sVar156) - sVar134) + (sVar179 - sVar150)) >> 3;
    uVar216 = (ushort)((((uVar283 >> 8) * 3 + (uVar162 >> 8)) - sVar136) + (sVar180 - sVar152)) >> 3
    ;
    auVar185 = auVar185 & auVar223;
    auVar121._0_8_ =
         CONCAT17((uVar216 != 0) * (uVar216 < 0x100) * (char)uVar216 - (0xff < uVar216),
                  CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                           CONCAT15((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 -
                                    (0xff < uVar211),
                                    CONCAT14((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 -
                                             (0xff < uVar208),
                                             CONCAT13((uVar206 != 0) * (uVar206 < 0x100) *
                                                      (char)uVar206 - (0xff < uVar206),
                                                      CONCAT12((uVar203 != 0) * (uVar203 < 0x100) *
                                                               (char)uVar203 - (0xff < uVar203),
                                                               CONCAT11((uVar201 != 0) *
                                                                        (uVar201 < 0x100) *
                                                                        (char)uVar201 -
                                                                        (0xff < uVar201),
                                                                        (uVar196 != 0) *
                                                                        (uVar196 < 0x100) *
                                                                        (char)uVar196 -
                                                                        (0xff < uVar196)))))))) &
         auVar223._0_8_ | ~auVar223._0_8_ & auVar121._0_8_;
    uVar129 = CONCAT44(auVar185._0_4_,auVar185._0_4_);
    auVar176[0] = -(auVar185[0] == '\0');
    auVar176[1] = -(auVar185[1] == '\0');
    auVar176[2] = -(auVar185[2] == '\0');
    auVar176[3] = -(auVar185[3] == '\0');
    auVar176[4] = -(auVar185[0] == '\0');
    auVar176[5] = -(auVar185[1] == '\0');
    auVar176[6] = -(auVar185[2] == '\0');
    auVar176[7] = -(auVar185[3] == '\0');
    auVar176[8] = -(auVar185[4] == '\0');
    auVar176[9] = -(auVar185[5] == '\0');
    auVar176[10] = -(auVar185[6] == '\0');
    auVar176[0xb] = -(auVar185[7] == '\0');
    auVar176[0xc] = -(auVar185[4] == '\0');
    auVar176[0xd] = -(auVar185[5] == '\0');
    auVar176[0xe] = -(auVar185[6] == '\0');
    auVar176[0xf] = -(auVar185[7] == '\0');
    if ((ushort)((ushort)(SUB161(auVar176 >> 7,0) & 1) |
                 (ushort)(SUB161(auVar176 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar176 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar176 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar176 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar176 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar176 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar176 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar176 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar176 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar176 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar176 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar176 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar176 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar176 >> 0x77,0) & 1) << 0xe |
                (ushort)(auVar176[0xf] >> 7) << 0xf) != 0xffff) {
      auVar17._8_6_ = 0;
      auVar17._0_8_ = local_f8._0_8_;
      auVar17[0xe] = (char)((uint)uVar204 >> 0x18);
      auVar24._8_4_ = 0;
      auVar24._0_8_ = local_f8._0_8_;
      auVar24[0xc] = (char)((uint)uVar204 >> 0x10);
      auVar24._13_2_ = auVar17._13_2_;
      auVar31._8_4_ = 0;
      auVar31._0_8_ = local_f8._0_8_;
      auVar31._12_3_ = auVar24._12_3_;
      auVar38._8_2_ = 0;
      auVar38._0_8_ = local_f8._0_8_;
      auVar38[10] = (char)((uint)uVar204 >> 8);
      auVar38._11_4_ = auVar31._11_4_;
      auVar45._8_2_ = 0;
      auVar45._0_8_ = local_f8._0_8_;
      auVar45._10_5_ = auVar38._10_5_;
      auVar52[8] = (char)uVar204;
      auVar52._0_8_ = local_f8._0_8_;
      auVar52._9_6_ = auVar45._9_6_;
      auVar88._7_8_ = 0;
      auVar88._0_7_ = auVar52._8_7_;
      Var77 = CONCAT81(SUB158(auVar88 << 0x40,7),(char)((uint)uVar198 >> 0x18));
      auVar98._9_6_ = 0;
      auVar98._0_9_ = Var77;
      auVar89._1_10_ = SUB1510(auVar98 << 0x30,5);
      auVar89[0] = (char)((uint)uVar198 >> 0x10);
      auVar99._11_4_ = 0;
      auVar99._0_11_ = auVar89;
      auVar64[2] = (char)((uint)uVar198 >> 8);
      auVar64._0_2_ = (ushort)uVar198;
      auVar64._3_12_ = SUB1512(auVar99 << 0x20,3);
      auVar258._0_2_ = (ushort)uVar198 & 0xff;
      auVar258._2_13_ = auVar64._2_13_;
      auVar258[0xf] = 0;
      local_f8._0_8_ = ~uVar129 & auVar266._0_8_;
      auVar18._8_6_ = 0;
      auVar18._0_8_ = auVar266._0_8_;
      auVar18[0xe] = (char)((uint)uVar11 >> 0x18);
      uVar196 = auVar18._13_2_;
      auVar25._8_4_ = 0;
      auVar25._0_8_ = auVar266._0_8_;
      auVar25[0xc] = (char)((uint)uVar11 >> 0x10);
      auVar25._13_2_ = uVar196;
      auVar32._8_4_ = 0;
      auVar32._0_8_ = auVar266._0_8_;
      auVar32._12_3_ = auVar25._12_3_;
      auVar39._8_2_ = 0;
      auVar39._0_8_ = auVar266._0_8_;
      auVar39[10] = (char)((uint)uVar11 >> 8);
      auVar39._11_4_ = auVar32._11_4_;
      auVar46._8_2_ = 0;
      auVar46._0_8_ = auVar266._0_8_;
      auVar46._10_5_ = auVar39._10_5_;
      auVar53[8] = (char)uVar11;
      auVar53._0_8_ = auVar266._0_8_;
      auVar53._9_6_ = auVar46._9_6_;
      auVar90._7_8_ = 0;
      auVar90._0_7_ = auVar53._8_7_;
      Var80 = CONCAT81(SUB158(auVar90 << 0x40,7),(char)((uint)uVar1 >> 0x18));
      auVar100._9_6_ = 0;
      auVar100._0_9_ = Var80;
      auVar59[4] = (char)((uint)uVar1 >> 0x10);
      auVar59._0_4_ = uVar1;
      auVar59._5_10_ = SUB1510(auVar100 << 0x30,5);
      auVar91._11_4_ = 0;
      auVar91._0_11_ = auVar59._4_11_;
      auVar65[2] = (char)((uint)uVar1 >> 8);
      auVar65._0_2_ = (ushort)uVar1;
      auVar65._3_12_ = SUB1512(auVar91 << 0x20,3);
      uVar265 = (ushort)uVar1 & 0xff;
      auVar19._8_6_ = 0;
      auVar19._0_8_ = auVar288._0_8_;
      auVar19[0xe] = uVar305;
      uVar201 = auVar19._13_2_;
      auVar26._8_4_ = 0;
      auVar26._0_8_ = auVar288._0_8_;
      auVar26[0xc] = uVar304;
      auVar26._13_2_ = uVar201;
      auVar33._8_4_ = 0;
      auVar33._0_8_ = auVar288._0_8_;
      auVar33._12_3_ = auVar26._12_3_;
      auVar40._8_2_ = 0;
      auVar40._0_8_ = auVar288._0_8_;
      auVar40[10] = uVar303;
      auVar40._11_4_ = auVar33._11_4_;
      auVar47._8_2_ = 0;
      auVar47._0_8_ = auVar288._0_8_;
      auVar47._10_5_ = auVar40._10_5_;
      auVar54[8] = (char)uVar151;
      auVar54._0_8_ = auVar288._0_8_;
      auVar54._9_6_ = auVar47._9_6_;
      auVar92._7_8_ = 0;
      auVar92._0_7_ = auVar54._8_7_;
      Var83 = CONCAT81(SUB158(auVar92 << 0x40,7),uVar302);
      auVar101._9_6_ = 0;
      auVar101._0_9_ = Var83;
      auVar93._1_10_ = SUB1510(auVar101 << 0x30,5);
      auVar93[0] = uVar301;
      auVar102._11_4_ = 0;
      auVar102._0_11_ = auVar93;
      auVar66[2] = uVar300;
      auVar66._0_2_ = (ushort)uVar7;
      auVar66._3_12_ = SUB1512(auVar102 << 0x20,3);
      uVar216 = (ushort)uVar7 & 0xff;
      local_108 = ~uVar129 & auVar306._0_8_;
      sVar267 = auVar65._2_2_;
      sVar269 = auVar59._4_2_;
      sVar271 = (short)Var80;
      sVar274 = auVar53._8_2_;
      sVar277 = auVar39._10_2_;
      sVar280 = auVar25._12_2_;
      sVar161 = (uVar283 >> 8) + (uVar196 >> 8);
      sVar182 = uVar160 + uVar265 + uVar216;
      sVar177 = auVar66._2_2_;
      sVar186 = sVar122 + sVar267 + sVar177;
      sVar178 = auVar93._0_2_;
      sVar188 = sVar123 + sVar269 + sVar178;
      sVar179 = (short)Var83;
      sVar190 = sVar124 + sVar271 + sVar179;
      sVar180 = auVar54._8_2_;
      sVar192 = sVar125 + sVar274 + sVar180;
      sVar181 = auVar40._10_2_;
      sVar193 = sVar126 + sVar277 + sVar181;
      sVar157 = auVar26._12_2_;
      sVar194 = sVar127 + sVar280 + sVar157;
      sVar195 = sVar161 + (uVar201 >> 8);
      auVar105 = psllw(auVar258,2);
      sVar259 = auVar64._2_2_;
      sVar260 = auVar89._0_2_;
      sVar261 = (short)Var77;
      sVar262 = auVar52._8_2_;
      sVar263 = auVar38._10_2_;
      sVar264 = auVar24._12_2_;
      uVar203 = auVar17._13_2_ >> 8;
      sVar183 = sVar192 + sVar139 + sVar182 + sVar128 + 8;
      sVar187 = sVar193 + sVar141 + sVar186 + sVar133 + 8;
      sVar189 = sVar194 + sVar143 + sVar188 + sVar135 + 8;
      sVar191 = sVar195 + sVar145 + sVar190 + sVar137 + 8;
      sVar240 = sVar191 - (uVar201 >> 8);
      sVar163 = (sVar183 - uVar216) - uVar265;
      sVar167 = (sVar187 - sVar177) - sVar267;
      sVar170 = (sVar189 - sVar178) - sVar269;
      sVar173 = (sVar191 - sVar179) - sVar271;
      sVar220 = (sVar183 - sVar180) - sVar274;
      sVar226 = (sVar187 - sVar181) - sVar277;
      sVar234 = (sVar189 - sVar157) - sVar280;
      sVar241 = sVar240 - (uVar196 >> 8);
      sVar221 = sVar220 - sVar125;
      sVar227 = sVar226 - sVar126;
      sVar235 = sVar234 - sVar127;
      sVar242 = sVar241 - (uVar283 >> 8);
      sVar164 = sVar163 - uVar160;
      sVar168 = sVar167 - sVar122;
      sVar171 = sVar170 - sVar123;
      sVar174 = sVar173 - sVar124;
      sVar222 = sVar221 - sVar154;
      sVar228 = sVar227 - sVar155;
      sVar236 = sVar235 - sVar156;
      sVar243 = sVar242 - (uVar162 >> 8);
      sVar165 = sVar164 - uVar146;
      sVar169 = sVar168 - sVar149;
      sVar172 = sVar171 - sVar150;
      sVar175 = sVar174 - sVar152;
      uVar206 = (ushort)(sVar207 + sVar183 + uVar209 + uVar158 + auVar258._0_2_) >> 4;
      uVar208 = (ushort)(sVar210 + sVar187 + sVar200 + sVar132 + sVar259) >> 4;
      uVar211 = (ushort)(sVar213 + sVar189 + sVar202 + sVar134 + sVar260) >> 4;
      uVar214 = (ushort)((uVar217 >> 8) + sVar191 + sVar205 + sVar136 + sVar261) >> 4;
      uVar209 = (ushort)(sVar183 + uVar209 + sVar207 + sVar138 + sVar262) >> 4;
      uVar212 = (ushort)(sVar187 + sVar200 + sVar210 + sVar140 + sVar263) >> 4;
      uVar215 = (ushort)(sVar189 + sVar202 + sVar213 + sVar142 + sVar264) >> 4;
      uVar217 = (ushort)(sVar191 + sVar205 + (uVar217 >> 8) + (uVar153 >> 8) + uVar203) >> 4;
      uVar285 = CONCAT17((uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217),
                         CONCAT16((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 -
                                  (0xff < uVar215),
                                  CONCAT15((uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 -
                                           (0xff < uVar212),
                                           CONCAT14((uVar209 != 0) * (uVar209 < 0x100) *
                                                    (char)uVar209 - (0xff < uVar209),
                                                    CONCAT13((uVar214 != 0) * (uVar214 < 0x100) *
                                                             (char)uVar214 - (0xff < uVar214),
                                                             CONCAT12((uVar211 != 0) *
                                                                      (uVar211 < 0x100) *
                                                                      (char)uVar211 -
                                                                      (0xff < uVar211),
                                                                      CONCAT11((uVar208 != 0) *
                                                                               (uVar208 < 0x100) *
                                                                               (char)uVar208 -
                                                                               (0xff < uVar208),
                                                                               (uVar206 != 0) *
                                                                               (uVar206 < 0x100) *
                                                                               (char)uVar206 -
                                                                               (0xff < uVar206))))))
                                 )) & uVar129 | ~uVar129 & uVar285;
      uVar217 = (ushort)(sVar128 + auVar258._0_2_ * 2 + (sVar183 - sVar180)) >> 4;
      uVar206 = (ushort)(sVar133 + sVar259 * 2 + (sVar187 - sVar181)) >> 4;
      uVar208 = (ushort)(sVar135 + sVar260 * 2 + (sVar189 - sVar157)) >> 4;
      uVar211 = (ushort)(sVar137 + sVar261 * 2 + sVar240) >> 4;
      uVar214 = (ushort)((sVar183 - uVar216) + sVar139 + sVar262 * 2) >> 4;
      uVar209 = (ushort)((sVar187 - sVar177) + sVar141 + sVar263 * 2) >> 4;
      uVar212 = (ushort)((sVar189 - sVar178) + sVar143 + sVar264 * 2) >> 4;
      uVar215 = (ushort)((sVar191 - sVar179) + sVar145 + uVar203 * 2) >> 4;
      uVar307 = CONCAT17((uVar215 != 0) * (uVar215 < 0x100) * (char)uVar215 - (0xff < uVar215),
                         CONCAT16((uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 -
                                  (0xff < uVar212),
                                  CONCAT15((uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 -
                                           (0xff < uVar209),
                                           CONCAT14((uVar214 != 0) * (uVar214 < 0x100) *
                                                    (char)uVar214 - (0xff < uVar214),
                                                    CONCAT13((uVar211 != 0) * (uVar211 < 0x100) *
                                                             (char)uVar211 - (0xff < uVar211),
                                                             CONCAT12((uVar208 != 0) *
                                                                      (uVar208 < 0x100) *
                                                                      (char)uVar208 -
                                                                      (0xff < uVar208),
                                                                      CONCAT11((uVar206 != 0) *
                                                                               (uVar206 < 0x100) *
                                                                               (char)uVar206 -
                                                                               (0xff < uVar206),
                                                                               (uVar217 != 0) *
                                                                               (uVar217 < 0x100) *
                                                                               (char)uVar217 -
                                                                               (0xff < uVar217))))))
                                 )) & uVar129 | ~uVar129 & uVar307;
      uVar217 = (ushort)(uVar158 + uVar146 + uVar160 + auVar258._0_2_ * 3 + sVar220) >> 4;
      uVar206 = (ushort)(sVar132 + sVar149 + sVar122 + sVar259 * 3 + sVar226) >> 4;
      uVar208 = (ushort)(sVar134 + sVar150 + sVar123 + sVar260 * 3 + sVar234) >> 4;
      uVar211 = (ushort)(sVar136 + sVar152 + sVar124 + sVar261 * 3 + sVar241) >> 4;
      uVar214 = (ushort)(sVar163 + sVar138 + sVar154 + sVar125 + sVar262 * 3) >> 4;
      uVar209 = (ushort)(sVar167 + sVar140 + sVar155 + sVar126 + sVar263 * 3) >> 4;
      uVar212 = (ushort)(sVar170 + sVar142 + sVar156 + sVar127 + sVar264 * 3) >> 4;
      uVar283 = (ushort)(sVar173 + sVar144 + (uVar283 >> 8) + uVar203 * 3) >> 4;
      auVar121._0_8_ =
           CONCAT17((uVar283 != 0) * (uVar283 < 0x100) * (char)uVar283 - (0xff < uVar283),
                    CONCAT16((uVar212 != 0) * (uVar212 < 0x100) * (char)uVar212 - (0xff < uVar212),
                             CONCAT15((uVar209 != 0) * (uVar209 < 0x100) * (char)uVar209 -
                                      (0xff < uVar209),
                                      CONCAT14((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 -
                                               (0xff < uVar214),
                                               CONCAT13((uVar211 != 0) * (uVar211 < 0x100) *
                                                        (char)uVar211 - (0xff < uVar211),
                                                        CONCAT12((uVar208 != 0) * (uVar208 < 0x100)
                                                                 * (char)uVar208 - (0xff < uVar208),
                                                                 CONCAT11((uVar206 != 0) *
                                                                          (uVar206 < 0x100) *
                                                                          (char)uVar206 -
                                                                          (0xff < uVar206),
                                                                          (uVar217 != 0) *
                                                                          (uVar217 < 0x100) *
                                                                          (char)uVar217 -
                                                                          (0xff < uVar217)))))))) &
           uVar129 | ~uVar129 & auVar121._0_8_;
      uVar217 = (ushort)(uVar160 + uVar265 + uVar146 + auVar105._0_2_ + sVar221) >> 4;
      uVar283 = (ushort)(sVar122 + sVar267 + sVar149 + auVar105._2_2_ + sVar227) >> 4;
      uVar160 = (ushort)(sVar123 + sVar269 + sVar150 + auVar105._4_2_ + sVar235) >> 4;
      uVar206 = (ushort)(sVar124 + sVar271 + sVar152 + auVar105._6_2_ + sVar242) >> 4;
      uVar208 = (ushort)(sVar164 + sVar125 + sVar274 + sVar154 + auVar105._8_2_) >> 4;
      uVar211 = (ushort)(sVar168 + sVar126 + sVar277 + sVar155 + auVar105._10_2_) >> 4;
      uVar214 = (ushort)(sVar171 + sVar127 + sVar280 + sVar156 + auVar105._12_2_) >> 4;
      uVar162 = (ushort)(sVar174 + sVar161 + (uVar162 >> 8) + auVar105._14_2_) >> 4;
      auVar306._0_8_ =
           CONCAT17((uVar162 != 0) * (uVar162 < 0x100) * (char)uVar162 - (0xff < uVar162),
                    CONCAT16((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                             CONCAT15((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 -
                                      (0xff < uVar211),
                                      CONCAT14((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 -
                                               (0xff < uVar208),
                                               CONCAT13((uVar206 != 0) * (uVar206 < 0x100) *
                                                        (char)uVar206 - (0xff < uVar206),
                                                        CONCAT12((uVar160 != 0) * (uVar160 < 0x100)
                                                                 * (char)uVar160 - (0xff < uVar160),
                                                                 CONCAT11((uVar283 != 0) *
                                                                          (uVar283 < 0x100) *
                                                                          (char)uVar283 -
                                                                          (0xff < uVar283),
                                                                          (uVar217 != 0) *
                                                                          (uVar217 < 0x100) *
                                                                          (char)uVar217 -
                                                                          (0xff < uVar217)))))))) &
           uVar129 | local_108;
      uVar217 = (ushort)(auVar105._0_2_ + auVar258._0_2_ + sVar182 + sVar222) >> 4;
      uVar162 = (ushort)(auVar105._2_2_ + sVar259 + sVar186 + sVar228) >> 4;
      uVar283 = (ushort)(auVar105._4_2_ + sVar260 + sVar188 + sVar236) >> 4;
      uVar160 = (ushort)(auVar105._6_2_ + sVar261 + sVar190 + sVar243) >> 4;
      uVar206 = (ushort)(sVar165 + auVar105._8_2_ + sVar262 + sVar192) >> 4;
      uVar208 = (ushort)(sVar169 + auVar105._10_2_ + sVar263 + sVar193) >> 4;
      uVar211 = (ushort)(sVar172 + auVar105._12_2_ + sVar264 + sVar194) >> 4;
      uVar214 = (ushort)(sVar175 + auVar105._14_2_ + uVar203 + sVar195) >> 4;
      auVar266._0_8_ =
           CONCAT17((uVar214 != 0) * (uVar214 < 0x100) * (char)uVar214 - (0xff < uVar214),
                    CONCAT16((uVar211 != 0) * (uVar211 < 0x100) * (char)uVar211 - (0xff < uVar211),
                             CONCAT15((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 -
                                      (0xff < uVar208),
                                      CONCAT14((uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 -
                                               (0xff < uVar206),
                                               CONCAT13((uVar160 != 0) * (uVar160 < 0x100) *
                                                        (char)uVar160 - (0xff < uVar160),
                                                        CONCAT12((uVar283 != 0) * (uVar283 < 0x100)
                                                                 * (char)uVar283 - (0xff < uVar283),
                                                                 CONCAT11((uVar162 != 0) *
                                                                          (uVar162 < 0x100) *
                                                                          (char)uVar162 -
                                                                          (0xff < uVar162),
                                                                          (uVar217 != 0) *
                                                                          (uVar217 < 0x100) *
                                                                          (char)uVar217 -
                                                                          (0xff < uVar217)))))))) &
           uVar129 | local_f8._0_8_;
      uVar217 = (ushort)(uVar216 + uVar265 + auVar258._0_2_ * 7 + (sVar222 - sVar138)) >> 4;
      uVar162 = (ushort)(sVar177 + sVar267 + sVar259 * 7 + (sVar228 - sVar140)) >> 4;
      uVar283 = (ushort)(sVar178 + sVar269 + sVar260 * 7 + (sVar236 - sVar142)) >> 4;
      uVar153 = (ushort)(sVar179 + sVar271 + sVar261 * 7 + (sVar243 - (uVar153 >> 8))) >> 4;
      uVar160 = (ushort)(sVar180 + sVar274 + sVar262 * 7 + (sVar165 - uVar158)) >> 4;
      uVar206 = (ushort)(sVar181 + sVar277 + sVar263 * 7 + (sVar169 - sVar132)) >> 4;
      uVar208 = (ushort)(sVar157 + sVar280 + sVar264 * 7 + (sVar172 - sVar134)) >> 4;
      uVar196 = (ushort)((uVar201 >> 8) + (uVar196 >> 8) + uVar203 * 7 + (sVar175 - sVar136)) >> 4;
      auVar288._0_8_ =
           ~uVar129 & auVar288._0_8_ |
           CONCAT17((uVar196 != 0) * (uVar196 < 0x100) * (char)uVar196 - (0xff < uVar196),
                    CONCAT16((uVar208 != 0) * (uVar208 < 0x100) * (char)uVar208 - (0xff < uVar208),
                             CONCAT15((uVar206 != 0) * (uVar206 < 0x100) * (char)uVar206 -
                                      (0xff < uVar206),
                                      CONCAT14((uVar160 != 0) * (uVar160 < 0x100) * (char)uVar160 -
                                               (0xff < uVar160),
                                               CONCAT13((uVar153 != 0) * (uVar153 < 0x100) *
                                                        (char)uVar153 - (0xff < uVar153),
                                                        CONCAT12((uVar283 != 0) * (uVar283 < 0x100)
                                                                 * (char)uVar283 - (0xff < uVar283),
                                                                 CONCAT11((uVar162 != 0) *
                                                                          (uVar162 < 0x100) *
                                                                          (char)uVar162 -
                                                                          (0xff < uVar162),
                                                                          (uVar217 != 0) *
                                                                          (uVar217 < 0x100) *
                                                                          (char)uVar217 -
                                                                          (0xff < uVar217)))))))) &
           uVar129;
    }
  }
  *(int *)(s + -lVar103) = (int)uVar285;
  *(int *)s = (int)(uVar285 >> 0x20);
  *(int *)(s + lVar103 * -2) = (int)uVar307;
  *(int *)(s + lVar103) = (int)(uVar307 >> 0x20);
  *(int *)(s + lVar103 * -3) = (int)auVar121._0_8_;
  *(int *)(s + lVar103 * 2) = (int)(auVar121._0_8_ >> 0x20);
  *(int *)(s + lVar103 * -4) = (int)auVar306._0_8_;
  *(int *)(s + lVar103 * 3) = (int)(auVar306._0_8_ >> 0x20);
  *(int *)(s + lVar103 * -5) = (int)auVar266._0_8_;
  *(int *)(s + lVar103 * 4) = (int)(auVar266._0_8_ >> 0x20);
  *(int *)(s + lVar103 * -6) = (int)auVar288._0_8_;
  *(int *)(s + lVar103 * 5) = (int)(auVar288._0_8_ >> 0x20);
  return;
}

Assistant:

void aom_lpf_horizontal_14_sse2(unsigned char *s, int p,
                                const unsigned char *_blimit,
                                const unsigned char *_limit,
                                const unsigned char *_thresh) {
  __m128i q6p6, q5p5, q4p4, q3p3, q2p2, q1p1, q0p0;
  __m128i blimit = _mm_load_si128((const __m128i *)_blimit);
  __m128i limit = _mm_load_si128((const __m128i *)_limit);
  __m128i thresh = _mm_load_si128((const __m128i *)_thresh);

  q4p4 = _mm_unpacklo_epi32(xx_loadl_32(s - 5 * p), xx_loadl_32(s + 4 * p));
  q3p3 = _mm_unpacklo_epi32(xx_loadl_32(s - 4 * p), xx_loadl_32(s + 3 * p));
  q2p2 = _mm_unpacklo_epi32(xx_loadl_32(s - 3 * p), xx_loadl_32(s + 2 * p));
  q1p1 = _mm_unpacklo_epi32(xx_loadl_32(s - 2 * p), xx_loadl_32(s + 1 * p));

  q0p0 = _mm_unpacklo_epi32(xx_loadl_32(s - 1 * p), xx_loadl_32(s - 0 * p));

  q5p5 = _mm_unpacklo_epi32(xx_loadl_32(s - 6 * p), xx_loadl_32(s + 5 * p));

  q6p6 = _mm_unpacklo_epi32(xx_loadl_32(s - 7 * p), xx_loadl_32(s + 6 * p));

  lpf_internal_14_sse2(&q6p6, &q5p5, &q4p4, &q3p3, &q2p2, &q1p1, &q0p0, &blimit,
                       &limit, &thresh);

  store_buffer_horz_8(q0p0, p, 0, s);
  store_buffer_horz_8(q1p1, p, 1, s);
  store_buffer_horz_8(q2p2, p, 2, s);
  store_buffer_horz_8(q3p3, p, 3, s);
  store_buffer_horz_8(q4p4, p, 4, s);
  store_buffer_horz_8(q5p5, p, 5, s);
}